

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O0

void arkFreeVectors(ARKodeMem ark_mem)

{
  N_Vector *in_RDI;
  
  arkFreeVec(ark_mem,in_RDI);
  if (*(int *)(in_RDI + 0x48) == 0) {
    arkFreeVec(ark_mem,in_RDI);
  }
  arkFreeVec(ark_mem,in_RDI);
  arkFreeVec(ark_mem,in_RDI);
  arkFreeVec(ark_mem,in_RDI);
  arkFreeVec(ark_mem,in_RDI);
  arkFreeVec(ark_mem,in_RDI);
  arkFreeVec(ark_mem,in_RDI);
  arkFreeVec(ark_mem,in_RDI);
  arkFreeVec(ark_mem,in_RDI);
  arkFreeVec(ark_mem,in_RDI);
  return;
}

Assistant:

void arkFreeVectors(ARKodeMem ark_mem)
{
  arkFreeVec(ark_mem, &ark_mem->ewt);
  if (!ark_mem->rwt_is_ewt) { arkFreeVec(ark_mem, &ark_mem->rwt); }
  arkFreeVec(ark_mem, &ark_mem->tempv1);
  arkFreeVec(ark_mem, &ark_mem->tempv2);
  arkFreeVec(ark_mem, &ark_mem->tempv3);
  arkFreeVec(ark_mem, &ark_mem->tempv4);
  arkFreeVec(ark_mem, &ark_mem->tempv5);
  arkFreeVec(ark_mem, &ark_mem->yn);
  arkFreeVec(ark_mem, &ark_mem->fn);
  arkFreeVec(ark_mem, &ark_mem->Vabstol);
  arkFreeVec(ark_mem, &ark_mem->constraints);
}